

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

int32 hash_table_lookup_bkey(hash_table_t *h,char *key,size_t len,void **val)

{
  uint32 hash;
  int32 iVar1;
  char *key_00;
  hash_entry_t *phVar2;
  
  key_00 = makekey((uint8 *)key,len,(char *)len);
  hash = key2hash(h,key_00);
  ckd_free(key_00);
  phVar2 = lookup(h,hash,key,len);
  if (phVar2 == (hash_entry_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (val != (void **)0x0) {
      *val = phVar2->val;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int32
hash_table_lookup_bkey(hash_table_t * h, const char *key, size_t len, void ** val)
{
    hash_entry_t *entry;
    uint32 hash;
    char *str;

    str = makekey((uint8 *) key, len, NULL);
    hash = key2hash(h, str);
    ckd_free(str);

    entry = lookup(h, hash, key, len);
    if (entry) {
        if (val)
            *val = entry->val;
        return 0;
    }
    else
        return -1;
}